

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O3

bool __thiscall
TreePropagator::reachable
          (TreePropagator *this,int node,vector<bool,_std::allocator<bool>_> *blue,bool doDFS)

{
  __node_base_ptr *pp_Var1;
  BoolView *pBVar2;
  uint uVar3;
  undefined7 in_register_00000009;
  int *pt;
  __node_base _Var4;
  anon_union_8_2_743a5d44_for_Reason_0 r;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  size_t sVar8;
  ulong uVar9;
  long lVar10;
  Clause *expl;
  int count;
  anon_union_8_2_743a5d44_for_Reason_0 local_d0;
  vec<Lit> local_c8;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_b0;
  long local_78;
  vector<bool,_std::allocator<bool>_> *local_70;
  long local_68;
  vec<TrailElem> *local_60;
  vector<bool,_std::allocator<bool>_> local_58;
  
  if ((int)CONCAT71(in_register_00000009,doDFS) != 0) {
    local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p._0_1_ = 0;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&local_b0,
               (long)(int)(this->super_GraphPropagator).vs.sz,(bool *)&local_58,
               (allocator_type *)&local_c8);
    std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
              (&blue->super__Bvector_base<std::allocator<bool>_>);
    (blue->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
    _M_end_of_storage =
         (_Bit_pointer)
         CONCAT44(local_b0._M_rehash_policy._4_4_,local_b0._M_rehash_policy._M_max_load_factor);
    (blue->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)local_b0._M_before_begin._M_nxt;
    *(size_type *)
     &(blue->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_finish.
      super__Bit_iterator_base._M_offset = local_b0._M_element_count;
    (blue->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)local_b0._M_buckets;
    *(size_type *)
     &(blue->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_offset = local_b0._M_bucket_count;
    local_b0._M_buckets = (__buckets_ptr)((ulong)local_b0._M_buckets & 0xffffffff00000000);
    DFSBlue(this,node,blue,(int *)&local_b0);
  }
  uVar7 = (this->super_GraphPropagator).vs.sz;
  if (0 < (int)uVar7) {
    uVar9 = 0;
    local_78 = (ulong)(uint)node << 4;
    local_60 = &engine.trail;
    local_70 = blue;
    do {
      if (((blue->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[uVar9 >> 6 & 0x3ffffff] >> (uVar9 & 0x3f) & 1) ==
          0) {
        pBVar2 = (this->super_GraphPropagator).vs.data;
        lVar10 = uVar9 * 0x10;
        uVar3 = pBVar2[uVar9].v;
        if (sat.assigns.data[uVar3] == '\0') {
          if (so.lazy == true) {
            local_b0._M_buckets = &local_b0._M_single_bucket;
            local_b0._M_bucket_count = 1;
            local_b0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            local_b0._M_element_count = 0;
            local_b0._M_rehash_policy._M_max_load_factor = 1.0;
            local_b0._M_rehash_policy._M_next_resize = 0;
            local_b0._M_single_bucket = (__node_base_ptr)0x0;
            local_c8._0_8_ = (ulong)(uint7)local_c8._1_7_ << 8;
            std::vector<bool,_std::allocator<bool>_>::vector
                      (&local_58,(long)(int)uVar7,(bool *)&local_c8,(allocator_type *)&local_d0);
            DFSPink(this,(int)uVar9,&local_58,blue,
                    (unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                    &local_b0);
            local_c8.sz = 0;
            local_c8.cap = 0;
            local_c8.data = (Lit *)0x0;
            local_68 = lVar10;
            vec<Lit>::push(&local_c8);
            uVar7 = *(uint *)((long)&((this->super_GraphPropagator).vs.data)->v + local_78);
            local_d0._a._0_4_ = (uint)((int)sat.assigns.data[uVar7] - 1U < 0xfffffffd) + uVar7 * 2;
            vec<Lit>::push(&local_c8,(Lit *)&local_d0);
            for (_Var4._M_nxt = local_b0._M_before_begin._M_nxt;
                _Var4._M_nxt != (_Hash_node_base *)0x0; _Var4._M_nxt = (_Var4._M_nxt)->_M_nxt) {
              uVar7 = (this->super_GraphPropagator).es.data[*(uint *)&_Var4._M_nxt[1]._M_nxt].v;
              local_d0._a._0_4_ = (uint)((int)sat.assigns.data[uVar7] - 1U < 0xfffffffd) + uVar7 * 2
              ;
              vec<Lit>::push(&local_c8,(Lit *)&local_d0);
            }
            uVar7 = local_c8.sz;
            uVar6 = local_c8._0_8_ & 0xffffffff;
            sVar8 = (ulong)(local_c8.sz - 1) * 4 + 8;
            if (local_c8.sz == 0) {
              sVar8 = 8;
            }
            local_d0._pt = (Clause *)malloc(sVar8);
            uVar3 = uVar7 << 8;
            (local_d0._pt)->data[0].x = -2;
            *(uint *)local_d0._pt = uVar3;
            if (uVar7 != 0) {
              uVar5 = 0;
              do {
                (local_d0._pt)->data[uVar5].x = local_c8.data[uVar5].x;
                uVar5 = uVar5 + 1;
              } while (uVar6 != uVar5);
            }
            *(uint *)local_d0._pt = uVar3 | 2;
            vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_d0._pt);
            lVar10 = local_68;
            blue = local_70;
            r = local_d0;
            if (local_c8.data != (Lit *)0x0) {
              free(local_c8.data);
            }
            if ((void *)CONCAT71(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p.
                                 _1_7_,local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                       super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                       _M_p._0_1_) != (void *)0x0) {
              operator_delete((void *)CONCAT71(local_58.super__Bvector_base<std::allocator<bool>_>.
                                               _M_impl.super__Bvector_impl_data._M_start.
                                               super__Bit_iterator_base._M_p._1_7_,
                                               local_58.super__Bvector_base<std::allocator<bool>_>.
                                               _M_impl.super__Bvector_impl_data._M_start.
                                               super__Bit_iterator_base._M_p._0_1_));
            }
            std::
            _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::~_Hashtable(&local_b0);
            pBVar2 = (this->super_GraphPropagator).vs.data;
            uVar3 = *(uint *)((long)&pBVar2->v + lVar10);
          }
          else {
            r._pt = (Clause *)0x0;
          }
          SAT::enqueue(&sat,(Lit)(((&pBVar2->s)[lVar10] ^ 1) + uVar3 * 2),(Reason)r);
          pp_Var1 = (__node_base_ptr *)
                    ((this->last_state_n).super__Vector_base<Tint,_std::allocator<Tint>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar9);
          local_b0._M_bucket_count = CONCAT44(4,*(undefined4 *)pp_Var1);
          local_b0._M_buckets = pp_Var1;
          vec<TrailElem>::push(local_60,(TrailElem *)&local_b0);
          *(undefined4 *)pp_Var1 = 1;
          uVar7 = (this->super_GraphPropagator).vs.sz;
        }
        else if ((uint)pBVar2[uVar9].s * -2 + 1 == (int)sat.assigns.data[uVar3]) {
          if (so.lazy == true) {
            local_b0._M_buckets = &local_b0._M_single_bucket;
            local_b0._M_bucket_count = 1;
            local_b0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            local_b0._M_element_count = 0;
            local_b0._M_rehash_policy._M_max_load_factor = 1.0;
            local_b0._M_rehash_policy._M_next_resize = 0;
            local_b0._M_single_bucket = (__node_base_ptr)0x0;
            local_c8._0_8_ = (ulong)(uint7)local_c8._1_7_ << 8;
            std::vector<bool,_std::allocator<bool>_>::vector
                      (&local_58,(long)(int)uVar7,(bool *)&local_c8,(allocator_type *)&local_d0);
            DFSPink(this,(int)uVar9,&local_58,blue,
                    (unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                    &local_b0);
            local_c8.sz = 0;
            local_c8.cap = 0;
            local_c8.data = (Lit *)0x0;
            uVar7 = *(uint *)((long)&((this->super_GraphPropagator).vs.data)->v + local_78);
            local_d0._a._0_4_ = (uint)((int)sat.assigns.data[uVar7] - 1U < 0xfffffffd) + uVar7 * 2;
            vec<Lit>::push(&local_c8,(Lit *)&local_d0);
            if (local_b0._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
              _Var4._M_nxt = local_b0._M_before_begin._M_nxt;
              do {
                uVar7 = (this->super_GraphPropagator).es.data[*(uint *)&_Var4._M_nxt[1]._M_nxt].v;
                local_d0._a._0_4_ =
                     (uint)((int)sat.assigns.data[uVar7] - 1U < 0xfffffffd) + uVar7 * 2;
                vec<Lit>::push(&local_c8,(Lit *)&local_d0);
                _Var4._M_nxt = (_Var4._M_nxt)->_M_nxt;
              } while (_Var4._M_nxt != (_Hash_node_base *)0x0);
            }
            uVar7 = (this->super_GraphPropagator).vs.data[uVar9].v;
            local_d0._a._0_4_ = (uint)((int)sat.assigns.data[uVar7] - 1U < 0xfffffffd) + uVar7 * 2;
            vec<Lit>::push(&local_c8,(Lit *)&local_d0);
            uVar7 = local_c8.sz;
            uVar9 = local_c8._0_8_ & 0xffffffff;
            sVar8 = 8;
            if (local_c8.sz != 0) {
              sVar8 = (ulong)(local_c8.sz - 1) * 4 + 8;
            }
            local_d0._pt = (Clause *)malloc(sVar8);
            uVar3 = uVar7 << 8;
            (local_d0._pt)->data[0].x = -2;
            *(uint *)local_d0._pt = uVar3;
            if (uVar7 != 0) {
              uVar6 = 0;
              do {
                (local_d0._pt)->data[uVar6].x = local_c8.data[uVar6].x;
                uVar6 = uVar6 + 1;
              } while (uVar9 != uVar6);
            }
            *(uint *)local_d0._pt = uVar3 | 2;
            vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_d0._pt);
            sat.confl = local_d0._pt;
            if (local_c8.data != (Lit *)0x0) {
              free(local_c8.data);
            }
            if ((void *)CONCAT71(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p.
                                 _1_7_,local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                       super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                       _M_p._0_1_) != (void *)0x0) {
              operator_delete((void *)CONCAT71(local_58.super__Bvector_base<std::allocator<bool>_>.
                                               _M_impl.super__Bvector_impl_data._M_start.
                                               super__Bit_iterator_base._M_p._1_7_,
                                               local_58.super__Bvector_base<std::allocator<bool>_>.
                                               _M_impl.super__Bvector_impl_data._M_start.
                                               super__Bit_iterator_base._M_p._0_1_));
            }
            std::
            _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::~_Hashtable(&local_b0);
          }
          return false;
        }
      }
      uVar9 = uVar9 + 1;
    } while ((long)uVar9 < (long)(int)uVar7);
  }
  return true;
}

Assistant:

bool TreePropagator::reachable(int node, std::vector<bool>& blue, bool doDFS) {
	if (doDFS) {
		blue = std::vector<bool>(nbNodes(), false);
		int count = 0;
		DFSBlue(node, blue, count);
	}
	for (int i = 0; i < nbNodes(); i++) {
		if (blue[i] == false && getNodeVar(i).isFixed() && getNodeVar(i).isTrue()) {
			if (so.lazy) {
				std::unordered_set<edge_id> badEdges;
				std::vector<bool> pink(nbNodes(), false);
				DFSPink(i, pink, blue, badEdges);
				// REASON: 0<i<n visited[i] /\ any-fixed-not-visited => fail

				vec<Lit> ps;
				assert(getNodeVar(node).isFixed());
				ps.push(getNodeVar(node).getValLit());
				std::unordered_set<edge_id>::iterator it;
				for (it = badEdges.begin(); it != badEdges.end(); ++it) {
					assert(getEdgeVar(*it).isFixed());
					ps.push(getEdgeVar(*it).getValLit());
				}
				assert(getNodeVar(i).isFixed());
				ps.push(getNodeVar(i).getValLit());
				Clause* expl = Clause_new(ps);
				expl->temp_expl = 1;
				sat.rtrail.last().push(expl);
				sat.confl = expl;
			}
			return false;
		}
		if (blue[i] == false && !getNodeVar(i).isFixed()) {
			Clause* r = nullptr;
			if (so.lazy) {
				std::unordered_set<edge_id> badEdges;
				std::vector<bool> pink(nbNodes(), false);
				DFSPink(i, pink, blue, badEdges);
				// REASON: 0<i<n visited[i] => unfixed-not-visited = false

				vec<Lit> ps;
				ps.push();
				assert(getNodeVar(node).isFixed());
				ps.push(getNodeVar(node).getValLit());
				std::unordered_set<edge_id>::iterator it;
				for (it = badEdges.begin(); it != badEdges.end(); ++it) {
					assert(getEdgeVar(*it).isFixed());
					ps.push(getEdgeVar(*it).getValLit());
				}
				r = Reason_new(ps);
			}
			// cout << "REACHABLE (N) "<<i<<endl;
			getNodeVar(i).setVal2(false, r);
			last_state_n[i] = VT_OUT;
		}
	}
	return true;
}